

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetSourceFilesPropertiesCommand.cxx
# Opt level: O3

bool cmSetSourceFilesPropertiesCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last1;
  pointer __s1;
  size_t __n;
  cmMakefile *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  long *plVar2;
  pointer pbVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  cmSourceFile *sf;
  char *pcVar9;
  bool bVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __begin1;
  ulong uVar11;
  pointer sourceName;
  bool source_file_target_option_enabled;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __end1;
  long lVar12;
  size_type __rlen;
  string *prop;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string errors;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> source_file_directory_makefiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source_file_target_directories;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source_file_directories;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  undefined1 local_108 [40];
  const_iterator local_e0;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  size_t local_c8;
  pointer local_c0;
  undefined8 local_b8;
  char *local_b0;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  _Var7._M_current =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  __last1._M_current =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)__last1._M_current - (long)_Var7._M_current) < 0x21) {
    local_d8._M_len = (size_t)&local_c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((size_t *)local_d8._M_len != &local_c8) {
      operator_delete((void *)local_d8._M_len,local_c8 + 1);
    }
    bVar10 = false;
  }
  else {
    _Var7 = std::
            find_first_of<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::basic_string_view<char,std::char_traits<char>>const*>
                      (_Var7,__last1,cmSetSourceFilesPropertiesCommand::prop_names,
                       (basic_string_view<char,_std::char_traits<char>_> *)
                       &std::
                        _Sp_counted_ptr_inplace<std::__cxx11::string,std::allocator<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
                        ::vtable);
    iVar6 = 0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e0._M_current = _Var7._M_current;
    if (_Var7._M_current ==
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      source_file_target_option_enabled = false;
      bVar10 = false;
    }
    else {
      local_50 = (string *)&status->Error;
      bVar10 = false;
      source_file_target_option_enabled = false;
      do {
        iVar5 = std::__cxx11::string::compare((char *)_Var7._M_current);
        if (iVar5 == 0) {
          bVar10 = true;
          iVar6 = 1;
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)_Var7._M_current);
          if (iVar5 == 0) {
            source_file_target_option_enabled = true;
            iVar6 = 2;
          }
          else {
            __s1 = ((_Var7._M_current)->_M_dataplus)._M_p;
            __n = (_Var7._M_current)->_M_string_length;
            uVar11 = 3;
            lVar12 = 0;
            do {
              if (*(size_t *)
                   ((long)&cmSetSourceFilesPropertiesCommand::prop_names[0]._M_len + lVar12) == __n)
              {
                if ((__n == 0) ||
                   (iVar5 = bcmp(__s1,*(void **)((long)&cmSetSourceFilesPropertiesCommand::
                                                        prop_names[0]._M_str + lVar12),__n),
                   iVar5 == 0)) {
                  if (lVar12 != 0x80) goto LAB_002bba2c;
                  break;
                }
                if (*(size_t *)
                     ((long)&cmSetSourceFilesPropertiesCommand::prop_names[1]._M_len + lVar12) ==
                    __n) goto LAB_002bb864;
              }
              else if (*(size_t *)
                        ((long)&cmSetSourceFilesPropertiesCommand::prop_names[1]._M_len + lVar12) ==
                       __n) {
                if (__n == 0) goto LAB_002bba2c;
LAB_002bb864:
                iVar5 = bcmp(__s1,*(void **)((long)&cmSetSourceFilesPropertiesCommand::prop_names[1]
                                                    ._M_str + lVar12),__n);
                if (iVar5 == 0) goto LAB_002bba2c;
              }
              if (*(size_t *)
                   ((long)&cmSetSourceFilesPropertiesCommand::prop_names[2]._M_len + lVar12) == __n)
              {
                if ((__n == 0) ||
                   (iVar5 = bcmp(__s1,*(void **)((long)&cmSetSourceFilesPropertiesCommand::
                                                        prop_names[2]._M_str + lVar12),__n),
                   iVar5 == 0)) goto LAB_002bba2c;
                if (*(size_t *)
                     ((long)&cmSetSourceFilesPropertiesCommand::prop_names[3]._M_len + lVar12) ==
                    __n) goto LAB_002bb8bd;
              }
              else if (*(size_t *)
                        ((long)&cmSetSourceFilesPropertiesCommand::prop_names[3]._M_len + lVar12) ==
                       __n) {
                if (__n == 0) goto LAB_002bba2c;
LAB_002bb8bd:
                iVar5 = bcmp(__s1,*(void **)((long)&cmSetSourceFilesPropertiesCommand::prop_names[3]
                                                    ._M_str + lVar12),__n);
                if (iVar5 == 0) goto LAB_002bba2c;
              }
              lVar12 = lVar12 + 0x40;
              uVar11 = uVar11 - 1;
            } while (1 < uVar11);
            if (iVar6 == 2) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_88,_Var7._M_current);
              iVar6 = 2;
            }
            else if (iVar6 == 1) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_68,_Var7._M_current);
              iVar6 = 1;
            }
            else {
              local_d8._M_len = 0x18;
              local_d8._M_str = "given invalid argument \"";
              local_b8 = 2;
              local_b0 = "\".";
              views._M_len = 3;
              views._M_array = &local_d8;
              local_c8 = __n;
              local_c0 = __s1;
              cmCatViews_abi_cxx11_((string *)local_108,views);
              std::__cxx11::string::_M_assign(local_50);
              if ((string *)local_108._0_8_ != (string *)(local_108 + 0x10)) {
                operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
              }
            }
          }
        }
        _Var7._M_current = _Var7._M_current + 1;
      } while (_Var7._M_current !=
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    }
LAB_002bba2c:
    bVar4 = SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes
                      (status,bVar10,source_file_target_option_enabled,&local_68,&local_88,&local_a8
                      );
    if (bVar4) {
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      SetPropertyCommand::MakeSourceFilePathsAbsoluteIfNeeded
                (status,&local_48,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,local_e0,
                 (bool)(source_file_target_option_enabled | bVar10));
      local_d8._M_len = (size_t)&local_c8;
      local_d8._M_str = (char *)0x0;
      local_c8 = local_c8 & 0xffffffffffffff00;
      bVar10 = true;
      local_e0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           local_a8.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_a8.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_a8.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_a8.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          pbVar3 = local_48.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          sourceName = local_48.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          this = (cmMakefile *)(pbVar8->_M_dataplus)._M_p;
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          local_108._0_8_ = (string *)0x0;
          local_108._8_8_ = (string *)0x0;
          local_108._16_8_ = 0;
          for (__args = _Var7._M_current; __args != pbVar1; __args = __args + 1) {
            iVar6 = std::__cxx11::string::compare((char *)__args);
            if (((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare((char *)__args), iVar6 == 0)
                ) || (iVar6 = std::__cxx11::string::compare((char *)__args), iVar6 == 0)) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string_const&>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         local_108,__args);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<char_const(&)[2]>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         local_108,(char (*) [2])0x818de8);
            }
            else {
              iVar6 = std::__cxx11::string::compare((char *)__args);
              if (iVar6 != 0) {
                iVar6 = std::__cxx11::string::compare((char *)__args);
                if (iVar6 == 0) {
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<char_const(&)[15]>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             local_108,(char (*) [15])"OBJECT_DEPENDS");
                  __args = __args + 1;
                  if (__args != pbVar1) {
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_108,__args);
                    goto LAB_002bbbcd;
                  }
                  pcVar9 = 
                  "called with incorrect number of arguments OBJECT_DEPENDS with no dependencies";
LAB_002bbd01:
                  std::__cxx11::string::_M_replace((ulong)&local_d8,0,local_d8._M_str,(ulong)pcVar9)
                  ;
                }
                else {
                  iVar6 = std::__cxx11::string::compare((char *)__args);
                  if (iVar6 != 0) {
                    pcVar9 = "called with illegal arguments, maybe missing a PROPERTIES specifier?";
                    goto LAB_002bbd01;
                  }
                  if (((int)pbVar1 - (int)(__args + 1) & 0x20U) == 0) {
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               local_108,local_108._8_8_,__args + 1);
                    break;
                  }
                  std::__cxx11::string::_M_replace((ulong)&local_d8,0,local_d8._M_str,0x7a59e8);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_108);
                std::__cxx11::string::_M_assign((string *)&status->Error);
                bVar10 = false;
                goto LAB_002bbd30;
              }
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<char_const(&)[14]>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         local_108,(char (*) [14])0x7abf3f);
              __args = __args + 1;
              if (__args == pbVar1) {
                pcVar9 = "called with incorrect number of arguments COMPILE_FLAGS with no flags";
                goto LAB_002bbd01;
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_108,__args);
            }
LAB_002bbbcd:
          }
          for (; sourceName != pbVar3; sourceName = sourceName + 1) {
            sf = cmMakefile::GetOrCreateSource(this,sourceName,false,Ambiguous);
            prop = (string *)local_108._0_8_;
            if (sf != (cmSourceFile *)0x0) {
              for (; prop != (string *)local_108._8_8_; prop = prop + 2) {
                if ((prop->_M_string_length == 9) &&
                   (plVar2 = (long *)(prop->_M_dataplus)._M_p,
                   (char)plVar2[1] == 'D' && *plVar2 == 0x45544152454e4547)) {
                  SetPropertyCommand::HandleAndValidateSourceFilePropertyGENERATED(sf,prop + 1,Set);
                }
                else {
                  cmSourceFile::SetProperty(sf,prop,prop + 1);
                }
              }
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_108);
          pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &pbVar8->_M_string_length;
        } while (pbVar8 != local_e0._M_current);
        bVar10 = true;
      }
LAB_002bbd30:
      if ((size_t *)local_d8._M_len != &local_c8) {
        operator_delete((void *)local_d8._M_len,local_c8 + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
    }
    else {
      bVar10 = false;
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_a8.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete(local_a8.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
  }
  return bVar10;
}

Assistant:

bool cmSetSourceFilesPropertiesCommand(std::vector<std::string> const& args,
                                       cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  // break the arguments into source file names and properties
  // old style allows for specifier before PROPERTIES keyword
  static const cm::string_view prop_names[] = {
    "ABSTRACT",       "GENERATED",  "WRAP_EXCLUDE", "COMPILE_FLAGS",
    "OBJECT_DEPENDS", "PROPERTIES", "DIRECTORY",    "TARGET_DIRECTORY"
  };

  auto isAPropertyKeyword =
    [](const std::vector<std::string>::const_iterator& arg_it) {
      return std::any_of(
        std::begin(prop_names), std::end(prop_names),
        [&arg_it](cm::string_view prop_name) { return *arg_it == prop_name; });
    };

  auto options_begin = std::find_first_of(
    args.begin(), args.end(), std::begin(prop_names), std::end(prop_names));
  auto options_it = options_begin;

  // Handle directory options.
  std::vector<std::string> source_file_directories;
  std::vector<std::string> source_file_target_directories;
  bool source_file_directory_option_enabled = false;
  bool source_file_target_option_enabled = false;
  std::vector<cmMakefile*> source_file_directory_makefiles;

  enum Doing
  {
    DoingNone,
    DoingSourceDirectory,
    DoingSourceTargetDirectory
  };
  Doing doing = DoingNone;
  for (; options_it != args.end(); ++options_it) {
    if (*options_it == "DIRECTORY") {
      doing = DoingSourceDirectory;
      source_file_directory_option_enabled = true;
    } else if (*options_it == "TARGET_DIRECTORY") {
      doing = DoingSourceTargetDirectory;
      source_file_target_option_enabled = true;
    } else if (isAPropertyKeyword(options_it)) {
      break;
    } else if (doing == DoingSourceDirectory) {
      source_file_directories.push_back(*options_it);
    } else if (doing == DoingSourceTargetDirectory) {
      source_file_target_directories.push_back(*options_it);
    } else {
      status.SetError(
        cmStrCat("given invalid argument \"", *options_it, "\"."));
    }
  }

  const auto props_begin = options_it;

  bool file_scopes_handled =
    SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes(
      status, source_file_directory_option_enabled,
      source_file_target_option_enabled, source_file_directories,
      source_file_target_directories, source_file_directory_makefiles);
  if (!file_scopes_handled) {
    return false;
  }

  std::vector<std::string> files;
  bool source_file_paths_should_be_absolute =
    source_file_directory_option_enabled || source_file_target_option_enabled;
  SetPropertyCommand::MakeSourceFilePathsAbsoluteIfNeeded(
    status, files, args.begin(), options_begin,
    source_file_paths_should_be_absolute);

  // Now call the worker function for each directory scope represented by a
  // cmMakefile instance.
  std::string errors;
  for (auto* const mf : source_file_directory_makefiles) {
    bool ret = RunCommandForScope(mf, files.begin(), files.end(), props_begin,
                                  args.end(), errors);
    if (!ret) {
      status.SetError(errors);
      return ret;
    }
  }

  return true;
}